

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

pString string_remove(pString str,size_t index,size_t len)

{
  ulong uVar1;
  char *__dest;
  pString pSVar2;
  
  uVar1 = str->len;
  if ((index <= uVar1) && (len + index <= uVar1)) {
    pSVar2 = string_allocate_memory(uVar1 - len);
    if (pSVar2 == (pString)0x0) {
      puts("string_remove: string_allocate_memory failed");
    }
    else {
      __dest = pSVar2->buf;
      memcpy(__dest,str->buf,index);
      memcpy(__dest + index,str->buf + len + index,str->len - (len + index));
    }
    return pSVar2;
  }
  puts("string_remove: index out of range");
  exit(1);
}

Assistant:

pString string_remove(pString str, size_t index, size_t len)
{
    if (index > str->len || index + len > str->len)
    {
        log("string_remove: index out of range");
        exit(1);
    }
    pString res = string_allocate_memory(str->len - len);
    if (res == NULL)
    {
        log("string_remove: string_allocate_memory failed");
        return NULL;
    }
    string_copy_chars(res->buf, str->buf, index);
    string_copy_chars(res->buf + index, str->buf + index + len, str->len - index - len);
    return res;
}